

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

bool __thiscall leveldb::DBImpl::GetProperty(DBImpl *this,Slice *property,string *value)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int64_t iVar5;
  undefined4 extraout_var;
  size_t sVar6;
  int level_1;
  ulong uVar7;
  long lVar8;
  CompactionStats *pCVar9;
  long in_FS_OFFSET;
  uint64_t level;
  Slice prefix;
  Slice in;
  char buf [100];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  value->_M_string_length = 0;
  *(value->_M_dataplus)._M_p = '\0';
  std::mutex::lock(&(this->mutex_).mu_);
  in.data_ = property->data_;
  in.size_ = property->size_;
  prefix.data_ = "leveldb.";
  prefix.size_ = 8;
  bVar2 = Slice::starts_with(&in,&prefix);
  if (bVar2) {
    Slice::remove_prefix(&in,prefix.size_);
    buf._0_8_ = anon_var_dwarf_1a7422f;
    buf[8] = '\x12';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    bVar2 = Slice::starts_with(&in,(Slice *)buf);
    if (bVar2) {
      Slice::remove_prefix(&in,0x12);
      bVar2 = ConsumeDecimalNumber(&in,&level);
      if ((!bVar2) || (in.size_ != 0 || 6 < level)) goto LAB_005321a5;
      uVar3 = VersionSet::NumLevelFiles(this->versions_,(int)level);
      snprintf(buf,100,"%d",(ulong)uVar3);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (value,buf);
    }
    else {
      buf._0_8_ = (long)"Failed to generate coins stats" + 0x19;
      buf[8] = '\x05';
      buf[9] = '\0';
      buf[10] = '\0';
      buf[0xb] = '\0';
      buf[0xc] = '\0';
      buf[0xd] = '\0';
      buf[0xe] = '\0';
      buf[0xf] = '\0';
      bVar2 = leveldb::operator==(&in,(Slice *)buf);
      if (bVar2) {
        memcpy(buf,
               "                               Compactions\nLevel  Files Size(MB) Time(sec) Read(MB) Write(MB)\n--------------------------------------------------\n"
               ,0x92);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (value,buf);
        pCVar9 = this->stats_;
        for (uVar7 = 0; uVar7 != 7; uVar7 = uVar7 + 1) {
          uVar3 = VersionSet::NumLevelFiles(this->versions_,(int)uVar7);
          if ((0 < (int)uVar3) || (0 < pCVar9->micros)) {
            iVar5 = VersionSet::NumLevelBytes(this->versions_,(int)uVar7);
            snprintf(buf,200,"%3d %8d %8.0f %9.0f %8.0f %9.0f\n",(double)iVar5 * 9.5367431640625e-07
                     ,(double)pCVar9->micros / 1000000.0,
                     (double)pCVar9->bytes_read * 9.5367431640625e-07,
                     (double)pCVar9->bytes_written * 9.5367431640625e-07,uVar7 & 0xffffffff,
                     (ulong)uVar3);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (value,buf);
          }
          pCVar9 = pCVar9 + 1;
        }
        bVar2 = true;
        goto LAB_005321a7;
      }
      buf._0_8_ = anon_var_dwarf_1a74287;
      buf[8] = '\b';
      buf[9] = '\0';
      buf[10] = '\0';
      buf[0xb] = '\0';
      buf[0xc] = '\0';
      buf[0xd] = '\0';
      buf[0xe] = '\0';
      buf[0xf] = '\0';
      bVar2 = leveldb::operator==(&in,(Slice *)buf);
      if (bVar2) {
        Version::DebugString_abi_cxx11_((string *)buf,this->versions_->current_);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf);
        std::__cxx11::string::~string((string *)buf);
      }
      else {
        buf._0_8_ = (long)"leveldb.approximate-memory-usage" + 8;
        buf[8] = '\x18';
        buf[9] = '\0';
        buf[10] = '\0';
        buf[0xb] = '\0';
        buf[0xc] = '\0';
        buf[0xd] = '\0';
        buf[0xe] = '\0';
        buf[0xf] = '\0';
        bVar2 = leveldb::operator==(&in,(Slice *)buf);
        if (!bVar2) goto LAB_005321a5;
        iVar4 = (*((this->options_).block_cache)->_vptr_Cache[9])();
        lVar8 = CONCAT44(extraout_var,iVar4);
        if (this->mem_ != (MemTable *)0x0) {
          sVar6 = MemTable::ApproximateMemoryUsage(this->mem_);
          lVar8 = lVar8 + sVar6;
        }
        if (this->imm_ != (MemTable *)0x0) {
          sVar6 = MemTable::ApproximateMemoryUsage(this->imm_);
          lVar8 = lVar8 + sVar6;
        }
        snprintf(buf,0x32,"%llu",lVar8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (value,buf);
      }
    }
    bVar2 = true;
  }
  else {
LAB_005321a5:
    bVar2 = false;
  }
LAB_005321a7:
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool DBImpl::GetProperty(const Slice& property, std::string* value) {
  value->clear();

  MutexLock l(&mutex_);
  Slice in = property;
  Slice prefix("leveldb.");
  if (!in.starts_with(prefix)) return false;
  in.remove_prefix(prefix.size());

  if (in.starts_with("num-files-at-level")) {
    in.remove_prefix(strlen("num-files-at-level"));
    uint64_t level;
    bool ok = ConsumeDecimalNumber(&in, &level) && in.empty();
    if (!ok || level >= config::kNumLevels) {
      return false;
    } else {
      char buf[100];
      snprintf(buf, sizeof(buf), "%d",
               versions_->NumLevelFiles(static_cast<int>(level)));
      *value = buf;
      return true;
    }
  } else if (in == "stats") {
    char buf[200];
    snprintf(buf, sizeof(buf),
             "                               Compactions\n"
             "Level  Files Size(MB) Time(sec) Read(MB) Write(MB)\n"
             "--------------------------------------------------\n");
    value->append(buf);
    for (int level = 0; level < config::kNumLevels; level++) {
      int files = versions_->NumLevelFiles(level);
      if (stats_[level].micros > 0 || files > 0) {
        snprintf(buf, sizeof(buf), "%3d %8d %8.0f %9.0f %8.0f %9.0f\n", level,
                 files, versions_->NumLevelBytes(level) / 1048576.0,
                 stats_[level].micros / 1e6,
                 stats_[level].bytes_read / 1048576.0,
                 stats_[level].bytes_written / 1048576.0);
        value->append(buf);
      }
    }
    return true;
  } else if (in == "sstables") {
    *value = versions_->current()->DebugString();
    return true;
  } else if (in == "approximate-memory-usage") {
    size_t total_usage = options_.block_cache->TotalCharge();
    if (mem_) {
      total_usage += mem_->ApproximateMemoryUsage();
    }
    if (imm_) {
      total_usage += imm_->ApproximateMemoryUsage();
    }
    char buf[50];
    snprintf(buf, sizeof(buf), "%llu",
             static_cast<unsigned long long>(total_usage));
    value->append(buf);
    return true;
  }

  return false;
}